

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

bool_t DataFree(nodecontext *p,node *Node,nodedata **i,bool_t DeletingNode)

{
  nodedata *pnVar1;
  nodenotify *pnVar2;
  cc_memheap *pcVar3;
  ulong Type_00;
  nodedata *pnVar4;
  size_t sVar5;
  notifyex *nx;
  nodenotify *m;
  nodenotify *n;
  nodedata *Data;
  datatype Type;
  bool_t DeletingNode_local;
  nodedata **i_local;
  node *Node_local;
  nodecontext *p_local;
  
  pnVar1 = *i;
  Type_00 = pnVar1->Code & 0x3f;
  if (Type_00 == 0xe) {
    pnVar4 = pnVar1 + 1;
    if (pnVar4 != (nodedata *)0x0) {
      if (pnVar1[1].Code != 0) {
        if (DeletingNode == 0) {
          pnVar1[2].Next = pnVar4;
        }
        else {
          pnVar1[2].Next = pnVar1 + 2;
        }
        return 0;
      }
      m = (nodenotify *)pnVar4->Next;
      while (m != (nodenotify *)0x0) {
        pnVar2 = m->Next;
        (*p->NodeHeap->Free)(p->NodeHeap,m,0x18);
        m = pnVar2;
      }
    }
  }
  else if ((Type_00 == 0x1b) && (p->ExprRelease != (_func_void_nodeexpr_ptr *)0x0)) {
    (*p->ExprRelease)((nodeexpr *)(pnVar1 + 1));
  }
  else if ((Type_00 == 0x17) && (pnVar1[1].Next != (nodedata *)0x0)) {
    Node_Release(pnVar1[1].Next);
  }
  else if ((Type_00 == 0x26) && (pnVar1[2].Next != (nodedata *)0x0)) {
    (*(code *)pnVar1[2].Next)(pnVar1[2].Code,pnVar1[1].Code);
  }
  *i = pnVar1->Next;
  pcVar3 = p->NodeHeap;
  sVar5 = Node_DataSize(Node,pnVar1->Code >> 8,Type_00,pnVar1 + 1,0x2a);
  (*pcVar3->Free)(pcVar3,pnVar1,sVar5 + 0x10);
  return 1;
}

Assistant:

static NOINLINE bool_t DataFree(nodecontext* p, node* Node, nodedata** i, bool_t DeletingNode)
{
    datatype Type;
    nodedata* Data = *i;
    nodenotify *n,*m;

    Type = Data->Code & TYPE_MASK;
    if (Type == TYPE_NODENOTIFY)
    {
        n=(nodenotify*)NodeData_Data(Data);
        if (n)
        {
            if (n->Func) // the notification list is being used
            {
                if (DeletingNode)
                    n->Referer = &n->Referer; // mark the node to be removed after the notification
                else
                    n->Referer = n; // mark all data to be freed after the notification
                return 0;
            }
            else
            {
                n=n->Next;
                while (n)
                {
                    m=n;
                    n=n->Next;
                    MemHeap_Free(p->NodeHeap,m,sizeof(nodenotify));
                }
            }
        }
    }
    else
    if (Type == TYPE_EXPR && p->ExprRelease)
        p->ExprRelease((nodeexpr*)NodeData_Data(Data));
    else
    if (Type == TYPE_NODE_REF && *(node**)NodeData_Data(Data))
        Node_Release(*(node**)NodeData_Data(Data));
    else
    if (Type == TYPE_NOTIFYEX)
    {
        notifyex *nx=(notifyex*)NodeData_Data(Data);
        if (nx->Free)
            nx->Free(nx->FreeCookie,nx->This);
    }

    *i = Data->Next;
    MemHeap_Free(p->NodeHeap,Data,sizeof(nodedata)+Node_DataSize(Node,(dataid)(Data->Code>>8),Type,NodeData_Data(Data),META_PARAM_UNSET)); // META_PARAM_UNSET is neutral for the type
    return 1;
}